

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.h
# Opt level: O3

void __thiscall cmQtAutoGenInitializer::MocT::MocT(MocT *this)

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  
  (this->super_GenVarsT).Enabled = false;
  (this->super_GenVarsT).Gen = MOC;
  psVar2 = cmQtAutoGen::GeneratorNameUpper_abi_cxx11_(MOC);
  (this->super_GenVarsT).GenNameUpper = psVar2;
  (this->super_GenVarsT).ExecutableTargetName._M_dataplus._M_p =
       (pointer)&(this->super_GenVarsT).ExecutableTargetName.field_2;
  (this->super_GenVarsT).ExecutableTargetName._M_string_length = 0;
  (this->super_GenVarsT).ExecutableTargetName.field_2._M_local_buf[0] = '\0';
  (this->super_GenVarsT).ExecutableTarget = (cmGeneratorTarget *)0x0;
  (this->super_GenVarsT).Executable._M_dataplus._M_p =
       (pointer)&(this->super_GenVarsT).Executable.field_2;
  (this->super_GenVarsT).Executable._M_string_length = 0;
  (this->super_GenVarsT).Executable.field_2._M_local_buf[0] = '\0';
  (this->super_GenVarsT).ExecutableFeatures.
  super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_GenVarsT).ExecutableFeatures.
  super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->PredefsCmd)._M_dataplus._M_p = (pointer)&(this->PredefsCmd).field_2;
  (this->PredefsCmd)._M_string_length = 0;
  (this->PredefsCmd).field_2._M_local_buf[0] = '\0';
  (this->Includes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Includes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Includes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->ConfigIncludes)._M_t._M_impl.super__Rb_tree_header;
  (this->ConfigIncludes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ConfigIncludes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ConfigIncludes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ConfigIncludes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ConfigIncludes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->Defines)._M_t._M_impl.super__Rb_tree_header;
  (this->Defines)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Defines)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Defines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Defines)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Defines)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ConfigDefines)._M_t._M_impl.super__Rb_tree_header;
  (this->ConfigDefines)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ConfigDefines)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ConfigDefines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ConfigDefines)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ConfigDefines)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->MocsCompilation)._M_dataplus._M_p = (pointer)&(this->MocsCompilation).field_2;
  (this->MocsCompilation)._M_string_length = 0;
  (this->MocsCompilation).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

MocT()
      : GenVarsT(GenT::MOC){}